

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void append(vec *v,void *element)

{
  void *__dest;
  void *new;
  void *element_local;
  vec *v_local;
  
  if (v->size == v->cap) {
    v->cap = v->cap << 1;
    __dest = malloc(v->cap * (ulong)v->element_size);
    memcpy(__dest,v->start,v->size * (ulong)v->element_size);
    free(v->start);
    v->start = __dest;
  }
  memcpy((void *)((long)v->start + v->size * (ulong)v->element_size),element,(ulong)v->element_size)
  ;
  v->size = v->size + 1;
  return;
}

Assistant:

void append(vec *v, void *element) {
    if (v->size == v->cap) {
        v->cap *= 2;
        void *new = malloc(v->cap * v->element_size);
        memcpy(new, v->start, v->size * v->element_size);
        free(v->start);
        v->start = new;
    }
    memcpy(v->start + v->size * v->element_size, element, v->element_size);
    v->size++;
}